

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall asmjit::v1_14::BaseEmitter::BaseEmitter(BaseEmitter *this,EmitterType emitterType)

{
  this->_vptr_BaseEmitter = (_func_int **)&PTR__BaseEmitter_00177248;
  this->_emitterType = emitterType;
  this->_archMask = 0;
  this->_encodingOptions = kNone;
  this->_diagnosticOptions = kNone;
  *(undefined8 *)&this->_emitterFlags = 0;
  this->_forcedInstOptions = kReserved;
  this->_privateData = 0;
  this->_code = (CodeHolder *)0x0;
  this->_logger = (Logger *)0x0;
  this->_errorHandler = (ErrorHandler *)0x0;
  (this->_environment)._arch = kUnknown;
  (this->_environment)._subArch = kHost;
  (this->_environment)._vendor = kHost;
  (this->_environment)._platform = kUnknown;
  (this->_environment)._platformABI = kUnknown;
  (this->_environment)._objectFormat = kUnknown;
  (this->_environment)._floatABI = kHardFloat;
  (this->_environment)._reserved = '\0';
  this->_gpSignature = 0;
  this->_instOptions = kNone;
  (this->_extraReg)._signature = 0;
  (this->_extraReg)._id = 0;
  this->_inlineComment = (char *)0x0;
  (this->_funcs).emitProlog = (EmitProlog)0x0;
  (this->_funcs).emitEpilog = (EmitEpilog)0x0;
  (this->_funcs).emitArgsAssignment = (EmitArgsAssignment)0x0;
  (this->_funcs).formatInstruction = (FormatInstruction)0x0;
  (this->_funcs).validate = (ValidateFunc)0x0;
  return;
}

Assistant:

BaseEmitter::~BaseEmitter() noexcept {
  if (_code) {
    _addEmitterFlags(EmitterFlags::kDestroyed);
    _code->detach(this);
  }
}